

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_bmp(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  byte *pbVar1;
  bool bVar2;
  uint3 uVar3;
  uchar *puVar4;
  byte bVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  CImg<unsigned_char> *pCVar9;
  CImgIOException *pCVar10;
  CImgArgumentException *pCVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  pointer_____offset_0x10___ *ppuVar22;
  byte bVar23;
  char *pcVar24;
  char *pcVar25;
  uint uVar26;
  size_t sVar27;
  FILE *pFVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  byte *pbVar32;
  CImg<unsigned_char> buffer;
  CImg<int> colormap;
  CImg<unsigned_char> header;
  uchar local_f9;
  ulong local_f8;
  FILE *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  uint local_c4;
  ulong local_c0;
  CImg<unsigned_char> local_b8;
  FILE *local_98;
  int local_8c;
  CImg<int> local_88;
  char *local_60;
  ulong local_58;
  CImg<unsigned_char> local_50;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    pCVar11 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar25 = "non-";
    if (this->_is_shared != false) {
      pcVar25 = "";
    }
    CImgArgumentException::CImgArgumentException
              (pCVar11,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar25,"unsigned char");
    __cxa_throw(pCVar11,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  local_98 = file;
  if (file == (FILE *)0x0) {
    file = (FILE *)cimg::fopen(filename,"rb");
  }
  local_60 = filename;
  CImg(&local_50,0x36,1,1,1);
  puVar4 = local_50._data;
  local_f0 = (FILE *)file;
  if (((FILE *)file == (FILE *)0x0) || (local_50._data == (uchar *)0x0)) {
    pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)pCVar10,
               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",0x36,
               "unsigned char","s",local_f0,local_50._data);
    ppuVar22 = &CImgArgumentException::typeinfo;
  }
  else {
    uVar20 = 0x36;
    lVar31 = 0;
    do {
      sVar27 = 0x3f00000;
      if (uVar20 < 0x3f00000) {
        sVar27 = uVar20;
      }
      sVar7 = fread(puVar4 + lVar31,1,sVar27,local_f0);
      lVar31 = lVar31 + sVar7;
      uVar20 = uVar20 - sVar7;
    } while ((sVar27 == sVar7) && (uVar20 != 0));
    if (uVar20 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar31,0x36);
    }
    pFVar28 = local_f0;
    if ((*local_50._data == 'B') && (local_50._data[1] == 'M')) {
      uVar29 = *(uint *)(local_50._data + 2);
      uVar19 = *(uint *)(local_50._data + 10);
      local_d8 = (ulong)*(uint *)(local_50._data + 0xe);
      local_d0 = (ulong)local_50._data[0x12];
      local_f8 = (ulong)(int)((uint)local_50._data[0x15] << 0x18 |
                             (uint)local_50._data[0x14] << 0x10 | (uint)local_50._data[0x13] << 8);
      uVar3 = *(uint3 *)(local_50._data + 0x16);
      local_c4 = (uint)local_50._data[0x19];
      local_8c = *(int *)(local_50._data + 0x1e);
      local_e0 = CONCAT44(local_e0._4_4_,*(undefined4 *)(local_50._data + 0x2e));
      uVar26 = (uint)*(ushort *)(local_50._data + 0x1c);
      local_e8 = CONCAT44(local_e8._4_4_,(uint)*(ushort *)(local_50._data + 0x1c));
      if ((uVar29 == 0) || (uVar20 = (ulong)uVar29, uVar8 = local_d0, uVar29 == uVar19)) {
        fseek(local_f0,0,2);
        uVar20 = ftell(pFVar28);
        uVar26 = (uint)local_e8;
        fseek(pFVar28,0x36,0);
        uVar8 = local_d0;
      }
      local_d0 = uVar20;
      local_f8 = local_f8 + uVar8;
      uVar29 = local_c4 << 0x18;
      if (0x28 < (int)local_d8) {
        fseek(local_f0,(ulong)((int)local_d8 - 0x28),1);
      }
      uVar30 = uVar3 | uVar29;
      iVar17 = (int)local_f8;
      if (uVar26 == 4) {
        uVar16 = ((uint)(local_f8 >> 0x1f) & 1) + iVar17;
        uVar20 = (ulong)(((int)uVar16 >> 1) + (iVar17 - (uVar16 & 0xfffffffe)));
      }
      else if (uVar26 == 1) {
        iVar15 = iVar17 + 7;
        if (-1 < iVar17) {
          iVar15 = iVar17;
        }
        uVar20 = (ulong)(((iVar15 >> 3) + 1) - (uint)((uVar8 & 7) == 0));
      }
      else {
        uVar8 = uVar26 * local_f8;
        uVar20 = uVar8 + 7;
        if (-1 < (long)uVar8) {
          uVar20 = uVar8;
        }
        uVar20 = uVar20 >> 3;
      }
      uVar6 = -(int)uVar20 & 3;
      local_c0 = (ulong)uVar6;
      uVar16 = -uVar30;
      if (0 < (int)uVar30) {
        uVar16 = uVar30;
      }
      local_58 = (ulong)uVar16;
      uVar6 = uVar6 + (int)uVar20;
      uVar8 = (long)(int)uVar6 * local_58;
      local_d0 = (long)(int)local_d0 - (long)(int)uVar19;
      if (uVar8 <= local_d0) {
        local_d0 = uVar8;
      }
      local_88._data = (int *)0x0;
      local_88._width = 0;
      local_88._height = 0;
      local_88._depth = 0;
      local_88._spectrum = 0;
      local_88._is_shared = false;
      uVar30 = 1 << ((byte)uVar26 & 0x1f);
      if ((uint)local_e0 != 0) {
        uVar30 = (uint)local_e0;
      }
      uVar16 = 0;
      if (uVar26 < 0x10) {
        CImg<int>::assign(&local_88,uVar30,1,1,1);
        cimg::fread<int>(local_88._data,(long)(int)uVar30,(FILE *)local_f0);
        uVar16 = uVar30;
      }
      pFVar28 = local_f0;
      uVar19 = (uVar19 - ((int)local_d8 + uVar16 * 4)) - 0xe;
      if (0 < (int)uVar19) {
        fseek(local_f0,(ulong)uVar19,1);
      }
      local_b8._data = (byte *)0x0;
      local_b8._width = 0;
      local_b8._height = 0;
      local_b8._depth = 0;
      local_b8._spectrum = 0;
      local_b8._is_shared = false;
      local_d8 = uVar20;
      if (local_d0 < 0x1800000) {
        local_f9 = '\0';
        pCVar9 = assign(&local_b8,(uint)local_d0,1,1,1);
        fill(pCVar9,&local_f9);
        puVar4 = local_b8._data;
        if (local_b8._data == (byte *)0x0) {
          pCVar11 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
          pcVar25 = "";
          if (1 < local_d0) {
            pcVar25 = "s";
          }
          CImgArgumentException::CImgArgumentException
                    (pCVar11,
                     "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                     local_d0,"unsigned char",pcVar25,pFVar28,0);
          __cxa_throw(pCVar11,&CImgArgumentException::typeinfo,CImgException::~CImgException);
        }
        if (local_d0 != 0) {
          lVar31 = 0;
          uVar20 = local_d0;
          local_c4 = uVar29;
          do {
            sVar27 = 0x3f00000;
            if (uVar20 < 0x3f00000) {
              sVar27 = uVar20;
            }
            sVar7 = fread(puVar4 + lVar31,1,sVar27,local_f0);
            uVar29 = local_c4;
            pFVar28 = local_f0;
            lVar31 = lVar31 + sVar7;
            uVar20 = uVar20 - sVar7;
          } while ((sVar27 == sVar7) && (uVar20 != 0));
          if (uVar20 != 0) {
            cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar31,
                       local_d0);
          }
        }
      }
      else {
        assign(&local_b8,uVar6,1,1,1);
      }
      pbVar32 = local_b8._data;
      if (local_8c - 1U < 2) {
        if (local_98 != (FILE *)0x0) {
          pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar25 = "non-";
          if (this->_is_shared != false) {
            pcVar25 = "";
          }
          CImgIOException::CImgIOException
                    (pCVar10,
                     "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Unable to load compressed data from \'(*FILE)\' inputs."
                     ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                     (ulong)this->_spectrum,this->_data,pcVar25,"unsigned char");
          __cxa_throw(pCVar10,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (pFVar28 == (FILE *)0x0) {
          cimg::warn("cimg::fclose(): Specified file is (null).");
        }
        else if (((_stdin != pFVar28) && (_stdout != pFVar28)) &&
                (uVar29 = fclose(pFVar28), uVar29 != 0)) {
          cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar29);
        }
        this = load_other(this,local_60);
      }
      else {
        local_f9 = '\0';
        pCVar9 = assign(this,(uint)local_f8,(uint)local_58,1,3);
        uVar20 = local_d8;
        fill(pCVar9,&local_f9);
        iVar17 = (int)uVar20;
        local_c4 = uVar29;
        if ((int)(uint)local_e8 < 0x10) {
          if ((uint)local_e8 == 1) {
            if ((1 < local_88._width) &&
               (uVar8 = (ulong)(int)this->_height, local_f8 = uVar8, 0 < (long)uVar8)) {
              local_e8 = (ulong)iVar17;
              local_e0 = local_c0 & 0xffffffff;
              uVar18 = local_d0;
              do {
                puVar4 = local_b8._data;
                uVar8 = uVar8 - 1;
                if (0x17fffff < uVar18) {
                  if (local_b8._data == (byte *)0x0) {
                    pCVar11 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                    pcVar25 = "";
                    if (1 < (uint)uVar20) {
                      pcVar25 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar11,
                               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,local_e8,"unsigned char",pcVar25,pFVar28,0);
                    __cxa_throw(pCVar11,&CImgArgumentException::typeinfo,
                                CImgException::~CImgException);
                  }
                  if ((uint)uVar20 == 0) {
                    lVar31 = 0;
                  }
                  else {
                    lVar31 = 0;
                    uVar18 = local_e8;
                    do {
                      sVar27 = 0x3f00000;
                      if (uVar18 < 0x3f00000) {
                        sVar27 = uVar18;
                      }
                      sVar7 = fread(puVar4 + lVar31,1,sVar27,local_f0);
                      lVar31 = lVar31 + sVar7;
                      uVar18 = uVar18 - sVar7;
                    } while ((sVar27 == sVar7) && (uVar18 != 0));
                    uVar20 = local_d8;
                    pFVar28 = local_f0;
                    if (uVar18 != 0) {
                      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
                                 lVar31,local_e8);
                      uVar20 = local_d8;
                      pFVar28 = local_f0;
                    }
                  }
                  uVar18 = local_d0;
                  if (lVar31 == 0) break;
                  fseek(pFVar28,local_e0,1);
                }
                uVar12 = (ulong)this->_width;
                if (0 < (int)this->_width) {
                  lVar31 = 0;
                  do {
                    this->_data[lVar31 + ((ulong)this->_height * 2 + uVar8) * (uVar12 & 0xffffffff)]
                         = (uchar)*local_88._data;
                    this->_data[lVar31 + (this->_height + uVar8) * (ulong)this->_width] =
                         *(uchar *)((long)local_88._data + 1);
                    this->_data[lVar31 + this->_width * uVar8] =
                         *(uchar *)((long)local_88._data + 2);
                    lVar31 = lVar31 + 1;
                    uVar12 = (ulong)(int)this->_width;
                  } while (lVar31 < (long)uVar12);
                }
                uVar12 = local_f8 - 1;
                bVar2 = 1 < (long)local_f8;
                local_f8 = uVar12;
              } while (bVar2);
            }
          }
          else if ((uint)local_e8 == 4) {
            if ((0xf < local_88._width) &&
               (uVar8 = (ulong)(int)this->_height, local_f8 = uVar8, 0 < (long)uVar8)) {
              local_e8 = (ulong)iVar17;
              local_e0 = local_c0 & 0xffffffff;
              uVar18 = local_d0;
              do {
                puVar4 = local_b8._data;
                uVar8 = uVar8 - 1;
                if (0x17fffff < uVar18) {
                  if (local_b8._data == (byte *)0x0) {
                    pCVar11 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                    pcVar25 = "";
                    if (1 < (uint)uVar20) {
                      pcVar25 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar11,
                               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,local_e8,"unsigned char",pcVar25,pFVar28,0);
                    __cxa_throw(pCVar11,&CImgArgumentException::typeinfo,
                                CImgException::~CImgException);
                  }
                  if ((uint)uVar20 == 0) {
                    lVar31 = 0;
                  }
                  else {
                    lVar31 = 0;
                    uVar18 = local_e8;
                    do {
                      sVar27 = 0x3f00000;
                      if (uVar18 < 0x3f00000) {
                        sVar27 = uVar18;
                      }
                      sVar7 = fread(puVar4 + lVar31,1,sVar27,local_f0);
                      lVar31 = lVar31 + sVar7;
                      uVar18 = uVar18 - sVar7;
                    } while ((sVar27 == sVar7) && (uVar18 != 0));
                    uVar20 = local_d8;
                    pFVar28 = local_f0;
                    if (uVar18 != 0) {
                      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
                                 lVar31,local_e8);
                      uVar20 = local_d8;
                      pFVar28 = local_f0;
                    }
                  }
                  uVar18 = local_d0;
                  if (lVar31 == 0) break;
                  fseek(pFVar28,local_e0,1);
                  pbVar32 = puVar4;
                }
                uVar12 = (ulong)this->_width;
                if (0 < (int)this->_width) {
                  bVar5 = 0xf0;
                  lVar31 = 0;
                  bVar14 = 0;
                  do {
                    if (bVar5 == 0xf0) {
                      bVar14 = *pbVar32;
                      pbVar32 = pbVar32 + 1;
                    }
                    bVar23 = (bVar14 & bVar5) >> 4;
                    if (bVar5 < 0x10) {
                      bVar23 = bVar14 & bVar5;
                    }
                    uVar21 = (ulong)bVar23;
                    this->_data[lVar31 + ((ulong)this->_height * 2 + uVar8) * (uVar12 & 0xffffffff)]
                         = (uchar)local_88._data[uVar21];
                    this->_data[lVar31 + (this->_height + uVar8) * (ulong)this->_width] =
                         *(uchar *)((long)local_88._data + uVar21 * 4 + 1);
                    bVar5 = bVar5 << 4 | bVar5 >> 4;
                    this->_data[lVar31 + this->_width * uVar8] =
                         *(uchar *)((long)local_88._data + uVar21 * 4 + 2);
                    lVar31 = lVar31 + 1;
                    uVar12 = (ulong)(int)this->_width;
                  } while (lVar31 < (long)uVar12);
                }
                uVar12 = local_f8 - 1;
                pbVar32 = pbVar32 + local_e0;
                bVar2 = 1 < (long)local_f8;
                local_f8 = uVar12;
              } while (bVar2);
            }
          }
          else if ((((uint)local_e8 == 8) && (0xff < local_88._width)) &&
                  (uVar8 = (ulong)(int)this->_height, local_f8 = uVar8, 0 < (long)uVar8)) {
            local_e8 = (ulong)iVar17;
            local_e0 = local_c0 & 0xffffffff;
            uVar18 = local_d0;
            do {
              puVar4 = local_b8._data;
              uVar8 = uVar8 - 1;
              if (0x17fffff < uVar18) {
                if (local_b8._data == (byte *)0x0) {
                  pCVar11 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                  pcVar25 = "";
                  if (1 < (uint)uVar20) {
                    pcVar25 = "s";
                  }
                  CImgArgumentException::CImgArgumentException
                            (pCVar11,
                             "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                             ,local_e8,"unsigned char",pcVar25,pFVar28,0);
                  __cxa_throw(pCVar11,&CImgArgumentException::typeinfo,CImgException::~CImgException
                             );
                }
                if ((uint)uVar20 == 0) {
                  lVar31 = 0;
                }
                else {
                  lVar31 = 0;
                  uVar18 = local_e8;
                  do {
                    sVar27 = 0x3f00000;
                    if (uVar18 < 0x3f00000) {
                      sVar27 = uVar18;
                    }
                    sVar7 = fread(puVar4 + lVar31,1,sVar27,local_f0);
                    lVar31 = lVar31 + sVar7;
                    uVar18 = uVar18 - sVar7;
                  } while ((sVar27 == sVar7) && (uVar18 != 0));
                  uVar20 = local_d8;
                  pFVar28 = local_f0;
                  if (uVar18 != 0) {
                    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
                               lVar31,local_e8);
                    uVar20 = local_d8;
                    pFVar28 = local_f0;
                  }
                }
                uVar18 = local_d0;
                if (lVar31 == 0) break;
                fseek(pFVar28,local_e0,1);
                pbVar32 = puVar4;
              }
              uVar12 = (ulong)this->_width;
              if (0 < (int)this->_width) {
                lVar31 = 0;
                do {
                  uVar21 = (ulong)pbVar32[lVar31];
                  this->_data[lVar31 + ((ulong)this->_height * 2 + uVar8) * (uVar12 & 0xffffffff)] =
                       (uchar)local_88._data[uVar21];
                  this->_data[lVar31 + (this->_height + uVar8) * (ulong)this->_width] =
                       *(uchar *)((long)local_88._data + uVar21 * 4 + 1);
                  this->_data[lVar31 + this->_width * uVar8] =
                       *(uchar *)((long)local_88._data + uVar21 * 4 + 2);
                  lVar31 = lVar31 + 1;
                  uVar12 = (ulong)(int)this->_width;
                } while (lVar31 < (long)uVar12);
                pbVar32 = pbVar32 + lVar31;
              }
              uVar12 = local_f8 - 1;
              pbVar32 = pbVar32 + local_e0;
              bVar2 = 1 < (long)local_f8;
              local_f8 = uVar12;
            } while (bVar2);
          }
        }
        else if ((uint)local_e8 == 0x10) {
          uVar8 = (ulong)(int)this->_height;
          local_f8 = uVar8;
          if (0 < (long)uVar8) {
            local_e8 = (ulong)iVar17;
            local_e0 = local_c0 & 0xffffffff;
            uVar18 = local_d0;
            do {
              puVar4 = local_b8._data;
              uVar8 = uVar8 - 1;
              if (0x17fffff < uVar18) {
                if (local_b8._data == (byte *)0x0) {
                  pCVar11 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                  pcVar25 = "";
                  if (1 < (uint)uVar20) {
                    pcVar25 = "s";
                  }
                  CImgArgumentException::CImgArgumentException
                            (pCVar11,
                             "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                             ,local_e8,"unsigned char",pcVar25,pFVar28,0);
                  __cxa_throw(pCVar11,&CImgArgumentException::typeinfo,CImgException::~CImgException
                             );
                }
                if ((uint)uVar20 == 0) {
                  lVar31 = 0;
                }
                else {
                  lVar31 = 0;
                  uVar18 = local_e8;
                  do {
                    sVar27 = 0x3f00000;
                    if (uVar18 < 0x3f00000) {
                      sVar27 = uVar18;
                    }
                    sVar7 = fread(puVar4 + lVar31,1,sVar27,local_f0);
                    lVar31 = lVar31 + sVar7;
                    uVar18 = uVar18 - sVar7;
                  } while ((sVar27 == sVar7) && (uVar18 != 0));
                  uVar20 = local_d8;
                  pFVar28 = local_f0;
                  if (uVar18 != 0) {
                    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
                               lVar31,local_e8);
                    uVar20 = local_d8;
                    pFVar28 = local_f0;
                  }
                }
                uVar18 = local_d0;
                if (lVar31 == 0) break;
                fseek(pFVar28,local_e0,1);
                pbVar32 = puVar4;
              }
              uVar12 = (ulong)this->_width;
              if (0 < (int)this->_width) {
                lVar31 = 0;
                lVar13 = 0;
                do {
                  bVar14 = pbVar32[lVar13 * 2];
                  bVar5 = pbVar32[lVar13 * 2 + 1];
                  this->_data[lVar13 + ((ulong)this->_height * 2 + uVar8) * (uVar12 & 0xffffffff)] =
                       bVar14 * '\b';
                  this->_data[lVar13 + (this->_height + uVar8) * (ulong)this->_width] =
                       (byte)(CONCAT11(bVar5,bVar14) >> 2) & 0xf8;
                  this->_data[lVar13 + this->_width * uVar8] = bVar5 & 0xf8;
                  lVar13 = lVar13 + 1;
                  uVar12 = (ulong)(int)this->_width;
                  lVar31 = lVar31 + 2;
                } while (lVar13 < (long)uVar12);
                pbVar32 = pbVar32 + lVar31;
              }
              uVar12 = local_f8 - 1;
              pbVar32 = pbVar32 + local_e0;
              bVar2 = 1 < (long)local_f8;
              local_f8 = uVar12;
            } while (bVar2);
          }
        }
        else if ((uint)local_e8 == 0x18) {
          uVar8 = (ulong)(int)this->_height;
          local_f8 = uVar8;
          if (0 < (long)uVar8) {
            local_e8 = (ulong)iVar17;
            local_e0 = local_c0 & 0xffffffff;
            uVar18 = local_d0;
            do {
              puVar4 = local_b8._data;
              uVar8 = uVar8 - 1;
              if (0x17fffff < uVar18) {
                if (local_b8._data == (byte *)0x0) {
                  pCVar11 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                  pcVar25 = "";
                  if (1 < (uint)uVar20) {
                    pcVar25 = "s";
                  }
                  CImgArgumentException::CImgArgumentException
                            (pCVar11,
                             "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                             ,local_e8,"unsigned char",pcVar25,pFVar28,0);
                  __cxa_throw(pCVar11,&CImgArgumentException::typeinfo,CImgException::~CImgException
                             );
                }
                if ((uint)uVar20 == 0) {
                  lVar31 = 0;
                }
                else {
                  lVar31 = 0;
                  uVar18 = local_e8;
                  do {
                    sVar27 = 0x3f00000;
                    if (uVar18 < 0x3f00000) {
                      sVar27 = uVar18;
                    }
                    sVar7 = fread(puVar4 + lVar31,1,sVar27,local_f0);
                    lVar31 = lVar31 + sVar7;
                    uVar18 = uVar18 - sVar7;
                  } while ((sVar27 == sVar7) && (uVar18 != 0));
                  uVar20 = local_d8;
                  pFVar28 = local_f0;
                  if (uVar18 != 0) {
                    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
                               lVar31,local_e8);
                    uVar20 = local_d8;
                    pFVar28 = local_f0;
                  }
                }
                uVar18 = local_d0;
                if (lVar31 == 0) break;
                fseek(pFVar28,local_e0,1);
                pbVar32 = puVar4;
              }
              uVar12 = (ulong)this->_width;
              if (0 < (int)this->_width) {
                lVar31 = 0;
                do {
                  this->_data[lVar31 + ((ulong)this->_height * 2 + uVar8) * (uVar12 & 0xffffffff)] =
                       *pbVar32;
                  this->_data[lVar31 + (this->_height + uVar8) * (ulong)this->_width] = pbVar32[1];
                  pbVar1 = pbVar32 + 2;
                  pbVar32 = pbVar32 + 3;
                  this->_data[lVar31 + this->_width * uVar8] = *pbVar1;
                  lVar31 = lVar31 + 1;
                  uVar12 = (ulong)(int)this->_width;
                } while (lVar31 < (long)uVar12);
              }
              uVar12 = local_f8 - 1;
              pbVar32 = pbVar32 + local_e0;
              bVar2 = 1 < (long)local_f8;
              local_f8 = uVar12;
            } while (bVar2);
          }
        }
        else if (((uint)local_e8 == 0x20) &&
                (uVar8 = (ulong)(int)this->_height, local_f8 = uVar8, 0 < (long)uVar8)) {
          local_e8 = (ulong)iVar17;
          local_e0 = local_c0 & 0xffffffff;
          uVar18 = local_d0;
          do {
            puVar4 = local_b8._data;
            uVar8 = uVar8 - 1;
            if (0x17fffff < uVar18) {
              if (local_b8._data == (byte *)0x0) {
                pCVar11 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar25 = "";
                if (1 < (uint)uVar20) {
                  pcVar25 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (pCVar11,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,local_e8,"unsigned char",pcVar25,pFVar28,0);
                __cxa_throw(pCVar11,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              if ((uint)uVar20 == 0) {
                lVar31 = 0;
              }
              else {
                lVar31 = 0;
                uVar18 = local_e8;
                do {
                  sVar27 = 0x3f00000;
                  if (uVar18 < 0x3f00000) {
                    sVar27 = uVar18;
                  }
                  sVar7 = fread(puVar4 + lVar31,1,sVar27,local_f0);
                  lVar31 = lVar31 + sVar7;
                  uVar18 = uVar18 - sVar7;
                } while ((sVar27 == sVar7) && (uVar18 != 0));
                uVar20 = local_d8;
                pFVar28 = local_f0;
                if (uVar18 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar31,
                             local_e8);
                  uVar20 = local_d8;
                  pFVar28 = local_f0;
                }
              }
              uVar18 = local_d0;
              if (lVar31 == 0) break;
              fseek(pFVar28,local_e0,1);
              pbVar32 = puVar4;
            }
            uVar12 = (ulong)this->_width;
            if (0 < (int)this->_width) {
              lVar31 = 0;
              lVar13 = 0;
              do {
                this->_data[lVar13 + ((ulong)this->_height * 2 + uVar8) * (uVar12 & 0xffffffff)] =
                     pbVar32[lVar13 * 4];
                this->_data[lVar13 + (this->_height + uVar8) * (ulong)this->_width] =
                     pbVar32[lVar13 * 4 + 1];
                this->_data[lVar13 + this->_width * uVar8] = pbVar32[lVar13 * 4 + 2];
                lVar13 = lVar13 + 1;
                uVar12 = (ulong)(int)this->_width;
                lVar31 = lVar31 + 4;
              } while (lVar13 < (long)uVar12);
              pbVar32 = pbVar32 + lVar31;
            }
            uVar12 = local_f8 - 1;
            pbVar32 = pbVar32 + local_e0;
            bVar2 = 1 < (long)local_f8;
            local_f8 = uVar12;
          } while (bVar2);
        }
        if ((int)local_c4 < 0) {
          mirror(this,'y');
        }
        if (local_98 == (FILE *)0x0) {
          if (pFVar28 == (FILE *)0x0) {
            cimg::warn("cimg::fclose(): Specified file is (null).");
          }
          else if (((_stdin != pFVar28) && (_stdout != pFVar28)) &&
                  (uVar29 = fclose(pFVar28), uVar29 != 0)) {
            cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar29);
          }
        }
      }
      if ((local_b8._is_shared == false) && (local_b8._data != (byte *)0x0)) {
        operator_delete__(local_b8._data);
      }
      if ((local_88._is_shared == false) && (local_88._data != (int *)0x0)) {
        operator_delete__(local_88._data);
      }
      if ((local_50._is_shared == false) && (local_50._data != (uchar *)0x0)) {
        operator_delete__(local_50._data);
      }
      return this;
    }
    if (local_98 == (FILE *)0x0) {
      cimg::fclose(local_f0);
    }
    pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar25 = "non-";
    if (this->_is_shared != false) {
      pcVar25 = "";
    }
    pcVar24 = "(FILE*)";
    if (local_60 != (char *)0x0) {
      pcVar24 = local_60;
    }
    CImgIOException::CImgIOException
              (pCVar10,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Invalid BMP file \'%s\'.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar25,"unsigned char",pcVar24);
    ppuVar22 = &CImgIOException::typeinfo;
  }
  __cxa_throw(pCVar10,ppuVar22,CImgException::~CImgException);
}

Assistant:

CImg<T>& _load_bmp(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_bmp(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<ucharT> header(54);
      cimg::fread(header._data,54,nfile);
      if (*header!='B' || header[1]!='M') {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_bmp(): Invalid BMP file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }

      // Read header and pixel buffer
      int
        file_size = header[0x02] + (header[0x03]<<8) + (header[0x04]<<16) + (header[0x05]<<24),
        offset = header[0x0A] + (header[0x0B]<<8) + (header[0x0C]<<16) + (header[0x0D]<<24),
        header_size = header[0x0E] + (header[0x0F]<<8) + (header[0x10]<<16) + (header[0x11]<<24),
        dx = header[0x12] + (header[0x13]<<8) + (header[0x14]<<16) + (header[0x15]<<24),
        dy = header[0x16] + (header[0x17]<<8) + (header[0x18]<<16) + (header[0x19]<<24),
        compression = header[0x1E] + (header[0x1F]<<8) + (header[0x20]<<16) + (header[0x21]<<24),
        nb_colors = header[0x2E] + (header[0x2F]<<8) + (header[0x30]<<16) + (header[0x31]<<24),
        bpp = header[0x1C] + (header[0x1D]<<8);

      if (!file_size || file_size==offset) {
        cimg::fseek(nfile,0,SEEK_END);
        file_size = (int)cimg::ftell(nfile);
        cimg::fseek(nfile,54,SEEK_SET);
      }
      if (header_size>40) cimg::fseek(nfile,header_size - 40,SEEK_CUR);

      const int
        dx_bytes = (bpp==1)?(dx/8 + (dx%8?1:0)):((bpp==4)?(dx/2 + (dx%2)):(int)((longT)dx*bpp/8)),
        align_bytes = (4 - dx_bytes%4)%4;
      const ulongT
        cimg_iobuffer = (ulongT)24*1024*1024,
        buf_size = std::min((ulongT)cimg::abs(dy)*(dx_bytes + align_bytes),(ulongT)file_size - offset);

      CImg<intT> colormap;
      if (bpp<16) { if (!nb_colors) nb_colors = 1<<bpp; } else nb_colors = 0;
      if (nb_colors) { colormap.assign(nb_colors); cimg::fread(colormap._data,nb_colors,nfile); }
      const int xoffset = offset - 14 - header_size - 4*nb_colors;
      if (xoffset>0) cimg::fseek(nfile,xoffset,SEEK_CUR);

      CImg<ucharT> buffer;
      if (buf_size<cimg_iobuffer) {
        buffer.assign(buf_size,1,1,1,0);
        cimg::fread(buffer._data,buf_size,nfile);
      } else buffer.assign(dx_bytes + align_bytes);
      unsigned char *ptrs = buffer;

      // Decompress buffer (if necessary)
      if (compression==1 || compression==2) {
        if (file)
          throw CImgIOException(_cimg_instance
                                "load_bmp(): Unable to load compressed data from '(*FILE)' inputs.",
                                cimg_instance);
        else {
          if (!file) cimg::fclose(nfile);
          return load_other(filename);
        }
      }

      // Read pixel data
      assign(dx,cimg::abs(dy),1,3,0);
      switch (bpp) {
      case 1 : { // Monochrome
        if (colormap._width>=2) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          unsigned char mask = 0x80, val = 0;
          cimg_forX(*this,x) {
            if (mask==0x80) val = *(ptrs++);
            const unsigned char *col = (unsigned char*)(colormap._data + (val&mask?1:0));
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
            mask = cimg::ror(mask);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 4 : { // 16 colors
        if (colormap._width>=16) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          unsigned char mask = 0xF0, val = 0;
          cimg_forX(*this,x) {
            if (mask==0xF0) val = *(ptrs++);
            const unsigned char color = (unsigned char)((mask<16)?(val&mask):((val&mask)>>4));
            const unsigned char *col = (unsigned char*)(colormap._data + color);
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
            mask = cimg::ror(mask,4);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 8 : { // 256 colors
        if (colormap._width>=256) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            const unsigned char *col = (unsigned char*)(colormap._data + *(ptrs++));
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 16 : { // 16 bits colors (RGB565)
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            const unsigned char c1 = *(ptrs++), c2 = *(ptrs++);
            const unsigned short col = (unsigned short)c2<<8 | c1;
            (*this)(x,y,2) = (T)((col&0x1F)<<3);
            (*this)(x,y,1) = (T)(((col>>5)&0x3F)<<3);
            (*this)(x,y,0) = (T)(((col>>11)&0x1F)<<3);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 24 : { // 24 bits colors
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            (*this)(x,y,2) = (T)*(ptrs++);
            (*this)(x,y,1) = (T)*(ptrs++);
            (*this)(x,y,0) = (T)*(ptrs++);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 32 : { // 32 bits colors
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            (*this)(x,y,2) = (T)*(ptrs++);
            (*this)(x,y,1) = (T)*(ptrs++);
            (*this)(x,y,0) = (T)*(ptrs++);
            ++ptrs;
          }
          ptrs+=align_bytes;
        }
      } break;
      }